

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_internal.h
# Opt level: O0

int exploration::generate_softmax<ACTION_SCORE::score_iterator,ACTION_SCORE::score_iterator>
              (float param_1,score_iterator *param_2,score_iterator *param_3,score_iterator *param_4
              ,score_iterator *param_5)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  float *pfVar4;
  float fVar5;
  double dVar6;
  score_iterator d_2;
  float prob;
  score_iterator d_1;
  score_iterator s;
  float max_score;
  float norm;
  score_iterator d;
  score_iterator pdf_new_last;
  size_t num_actions_pdf;
  size_t num_actions_scores;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  score_iterator *this;
  score_iterator *in_stack_ffffffffffffff20;
  score_iterator *in_stack_ffffffffffffff28;
  score_iterator local_c8;
  score_iterator local_b8;
  score_iterator local_a8;
  score_iterator local_98;
  score_iterator local_88;
  float local_78;
  float local_74;
  score_iterator local_70;
  score_iterator local_60;
  score_iterator local_50;
  size_t local_40;
  size_t local_38;
  score_iterator *local_30;
  score_iterator *local_28;
  score_iterator *local_20;
  score_iterator *local_18;
  float local_c;
  int local_4;
  
  this = param_3;
  local_30 = param_5;
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_c = param_1;
  bVar1 = ACTION_SCORE::score_iterator::operator<(param_3,param_2);
  if ((bVar1) || (bVar1 = ACTION_SCORE::score_iterator::operator<(param_5,param_4), bVar1)) {
    local_4 = 1;
  }
  else {
    local_38 = ACTION_SCORE::score_iterator::operator-(param_3,param_2);
    local_40 = ACTION_SCORE::score_iterator::operator-(param_5,param_4);
    if (local_38 != local_40) {
      std::min<unsigned_long>(&local_38,&local_40);
      ACTION_SCORE::score_iterator::operator+
                (this,CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ACTION_SCORE::score_iterator::operator=(param_3,&local_50);
      std::min<unsigned_long>(&local_38,&local_40);
      ACTION_SCORE::score_iterator::operator+
                (this,CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      ACTION_SCORE::score_iterator::score_iterator(&local_70,&local_60);
      while (bVar1 = ACTION_SCORE::score_iterator::operator!=(&local_70,param_5), bVar1) {
        pfVar4 = ACTION_SCORE::score_iterator::operator*(&local_70);
        *pfVar4 = 0.0;
        ACTION_SCORE::score_iterator::operator++(&local_70);
      }
      ACTION_SCORE::score_iterator::operator=(param_5,&local_60);
    }
    sVar3 = ACTION_SCORE::score_iterator::operator-(param_5,param_4);
    if (sVar3 == 0) {
      local_4 = 1;
    }
    else {
      local_74 = 0.0;
      ACTION_SCORE::score_iterator::score_iterator(&local_98,param_2);
      ACTION_SCORE::score_iterator::score_iterator(&local_a8,param_3);
      std::max_element<ACTION_SCORE::score_iterator>
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      pfVar4 = ACTION_SCORE::score_iterator::operator*(&local_88);
      local_78 = *pfVar4;
      ACTION_SCORE::score_iterator::score_iterator(&local_b8,param_2);
      ACTION_SCORE::score_iterator::score_iterator(&local_c8,param_4);
      while( true ) {
        bVar1 = ACTION_SCORE::score_iterator::operator!=(&local_c8,param_5);
        bVar2 = false;
        if (bVar1) {
          bVar2 = ACTION_SCORE::score_iterator::operator!=(&local_b8,param_3);
        }
        fVar5 = local_c;
        if (bVar2 == false) break;
        pfVar4 = ACTION_SCORE::score_iterator::operator*(&local_b8);
        dVar6 = std::exp((double)(ulong)(uint)(fVar5 * (*pfVar4 - local_78)));
        fVar5 = SUB84(dVar6,0);
        local_74 = fVar5 + local_74;
        pfVar4 = ACTION_SCORE::score_iterator::operator*(&local_c8);
        *pfVar4 = fVar5;
        ACTION_SCORE::score_iterator::operator++(&local_c8);
        ACTION_SCORE::score_iterator::operator++(&local_b8);
      }
      ACTION_SCORE::score_iterator::score_iterator
                ((score_iterator *)&stack0xffffffffffffff20,param_4);
      while (bVar1 = ACTION_SCORE::score_iterator::operator!=
                               ((score_iterator *)&stack0xffffffffffffff20,param_5),
            fVar5 = local_74, bVar1) {
        pfVar4 = ACTION_SCORE::score_iterator::operator*((score_iterator *)&stack0xffffffffffffff20)
        ;
        *pfVar4 = *pfVar4 / fVar5;
        ACTION_SCORE::score_iterator::operator++((score_iterator *)&stack0xffffffffffffff20);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int generate_softmax(float lambda, InputIt scores_first, InputIt scores_last, std::input_iterator_tag /* scores_tag */, OutputIt pdf_first, OutputIt pdf_last, std::random_access_iterator_tag /* pdf_tag */)
  {
    if (scores_last < scores_first || pdf_last < pdf_first)
      return E_EXPLORATION_BAD_RANGE;

    size_t num_actions_scores = scores_last - scores_first;
    size_t num_actions_pdf = pdf_last - pdf_first;

    if (num_actions_scores != num_actions_pdf)
    {
      // fallback to the minimum
      scores_last = scores_first + ((std::min)(num_actions_scores, num_actions_pdf));
      OutputIt pdf_new_last = pdf_first + ((std::min)(num_actions_scores, num_actions_pdf));

      // zero out pdf
      for (OutputIt d = pdf_new_last; d != pdf_last; ++d)
        *d = 0;

      pdf_last = pdf_new_last;
    }

    if (pdf_last - pdf_first == 0)
      return E_EXPLORATION_BAD_RANGE;

    float norm = 0.;
    float max_score = *std::max_element(scores_first, scores_last);

    InputIt s = scores_first;
    for (OutputIt d = pdf_first; d != pdf_last && s != scores_last; ++d, ++s)
    {
      float prob = exp(lambda*(*s - max_score));
      norm += prob;

      *d = prob;
    }

    // normalize
    for (OutputIt d = pdf_first; d != pdf_last; ++d)
      *d /= norm;

    return S_EXPLORATION_OK;
  }